

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O0

void loadPointProgram(void)

{
  bool bVar1;
  djg_program *program;
  char *file;
  runtime_error *this;
  char local_418 [8];
  char buf [1024];
  GLuint *glp;
  djg_program *djp;
  
  program = djgp_create();
  builtin_strncpy(buf + 0x3f8,"Ti$",4);
  buf[0x3fc] = '\0';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  file = strcat2(local_418,g_app.dir.shader,"Target.glsl");
  djgp_push_file(program,file);
  bVar1 = djgp_to_gl(program,0x1c2,false,true,(GLuint *)buf._1016_8_);
  if (!bVar1) {
    djgp_release(program);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"shader creation error");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  djgp_release(program);
  return;
}

Assistant:

void loadPointProgram()
{
    djg_program *djp = djgp_create();
    GLuint *glp = &g_gl.programs[PROGRAM_POINT];
    char buf[1024];

    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "Target.glsl"));
    if (!djgp_to_gl(djp, 450, false, true, glp)) {
        djgp_release(djp);

        throw std::runtime_error("shader creation error");
    }
    djgp_release(djp);
}